

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O0

void property_init(void)

{
  char *unaff_retaddr;
  
  set_default_properties();
  load_properties_from_file(unaff_retaddr);
  return;
}

Assistant:

void property_init(void)
{
    set_default_properties();
	load_properties_from_file(PROP_PATH_SYSTEM_DEFAULT);
}